

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O3

istream * serialize::read<std::__cxx11::string,std::__cxx11::string>
                    (istream *istream_,
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *container)

{
  mapped_type *pmVar1;
  size_t in_RCX;
  void *__buf;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t __nbytes;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t __nbytes_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar2;
  serialize *this;
  int iVar3;
  long lVar4;
  bool bVar5;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  int size;
  
  if (*(int *)(istream_ + *(long *)(*(long *)istream_ + -0x18) + 0x20) == 0) {
    pmVar2 = container;
    this = (serialize *)container;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&container->_M_t);
    if (LE()::le == '\0') {
      read<std::__cxx11::string,std::__cxx11::string>(this,(int)pmVar2,__buf,in_RCX);
    }
    if (LE()::le == '\0') {
      lVar4 = 3;
      do {
        std::istream::read((char *)istream_,(long)&value.field_2 + lVar4 + 0xc);
        bVar5 = lVar4 != 0;
        lVar4 = lVar4 + -1;
        __nbytes_00 = extraout_RDX_00;
      } while (bVar5);
    }
    else {
      std::istream::read((char *)istream_,(long)((long)&value.field_2 + 0xc));
      __nbytes_00 = extraout_RDX;
    }
    if (0 < (int)value.field_2._12_4_) {
      iVar3 = 0;
      do {
        local_78 = (undefined1  [8])&key._M_string_length;
        key._M_dataplus._M_p = (pointer)0x0;
        key._M_string_length._0_1_ = 0;
        key.field_2._8_8_ = &value._M_string_length;
        value._M_dataplus._M_p = (pointer)0x0;
        value._M_string_length._0_1_ = 0;
        read((int)istream_,(key_type *)local_78,__nbytes_00);
        read((int)istream_,(void *)((long)&key.field_2 + 8),__nbytes);
        pmVar1 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](container,(key_type *)local_78);
        std::__cxx11::string::_M_assign((string *)pmVar1);
        __nbytes_00 = extraout_RDX_01;
        if ((size_type *)key.field_2._8_8_ != &value._M_string_length) {
          operator_delete((void *)key.field_2._8_8_);
          __nbytes_00 = extraout_RDX_02;
        }
        if (local_78 != (undefined1  [8])&key._M_string_length) {
          operator_delete((void *)local_78);
          __nbytes_00 = extraout_RDX_03;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < (int)value.field_2._12_4_);
    }
  }
  return istream_;
}

Assistant:

static inline  istream& read(istream& istream_, map<K, V>& container)
{
	if (!istream_.good() || istream_.eof())return istream_;
	int size;
	container.clear();
	read(istream_, size);

	for (int i = 0; i < size; ++i)
	{
		K key;
		V value;
		read(istream_, key);

		read(istream_, value);
		container[key] = value;

	}
	return istream_;
}